

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCase::TestCase(TestCase *this,ITestInvoker *testCase,TestCaseInfo *info)

{
  TestCaseInfo::TestCaseInfo(&this->super_TestCaseInfo,info);
  std::__shared_ptr<Catch::ITestInvoker,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Catch::ITestInvoker,void>
            ((__shared_ptr<Catch::ITestInvoker,(__gnu_cxx::_Lock_policy)2> *)&this->test,testCase);
  return;
}

Assistant:

TestCase::TestCase( ITestInvoker* testCase, TestCaseInfo&& info ) : TestCaseInfo( std::move(info) ), test( testCase ) {}